

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::java::FileGenerator::Validate(FileGenerator *this,string *error)

{
  string *__rhs;
  __type _Var1;
  bool bVar2;
  FileDescriptor *pFVar3;
  int i;
  long lVar4;
  long lVar5;
  
  __rhs = &this->classname_;
  lVar5 = 0;
  lVar4 = 0;
  bVar2 = false;
  while ((pFVar3 = this->file_, lVar4 < *(int *)(pFVar3 + 0x58) && (!bVar2))) {
    _Var1 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                             (*(long *)(pFVar3 + 0x60) + lVar5),__rhs);
    if (_Var1) {
      bVar2 = true;
    }
    lVar4 = lVar4 + 1;
    lVar5 = lVar5 + 0x38;
  }
  lVar5 = 0;
  lVar4 = 0;
  while ((lVar4 < *(int *)(pFVar3 + 0x48) && (!bVar2))) {
    bVar2 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                             (*(long *)(pFVar3 + 0x50) + lVar5),__rhs);
    lVar4 = lVar4 + 1;
    pFVar3 = this->file_;
    lVar5 = lVar5 + 0x78;
  }
  lVar5 = 0;
  lVar4 = 0;
  while ((lVar4 < *(int *)(pFVar3 + 0x68) && (!bVar2))) {
    bVar2 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                             (*(long *)(pFVar3 + 0x70) + lVar5),__rhs);
    lVar4 = lVar4 + 1;
    pFVar3 = this->file_;
    lVar5 = lVar5 + 0x30;
  }
  if (bVar2) {
    std::__cxx11::string::_M_assign((string *)error);
    std::__cxx11::string::append((char *)error);
    std::__cxx11::string::append((string *)error);
    std::__cxx11::string::append((char *)error);
  }
  return (bool)~bVar2;
}

Assistant:

bool FileGenerator::Validate(string* error) {
  // Check that no class name matches the file's class name.  This is a common
  // problem that leads to Java compile errors that can be hard to understand.
  // It's especially bad when using the java_multiple_files, since we would
  // end up overwriting the outer class with one of the inner ones.

  bool found_conflict = false;
  for (int i = 0; i < file_->enum_type_count() && !found_conflict; i++) {
    if (file_->enum_type(i)->name() == classname_) {
      found_conflict = true;
    }
  }
  for (int i = 0; i < file_->message_type_count() && !found_conflict; i++) {
    if (file_->message_type(i)->name() == classname_) {
      found_conflict = true;
    }
  }
  for (int i = 0; i < file_->service_count() && !found_conflict; i++) {
    if (file_->service(i)->name() == classname_) {
      found_conflict = true;
    }
  }

  if (found_conflict) {
    error->assign(file_->name());
    error->append(
      ": Cannot generate Java output because the file's outer class name, \"");
    error->append(classname_);
    error->append(
      "\", matches the name of one of the types declared inside it.  "
      "Please either rename the type or use the java_outer_classname "
      "option to specify a different outer class name for the .proto file.");
    return false;
  }

  return true;
}